

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::EnsureFocusIsValid(App *this)

{
  ILayoutPtr IVar1;
  IWindowPtr focused;
  ILayoutPtr layout;
  __shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> local_30;
  element_type *local_20;
  
  IVar1 = WindowState::ActiveLayout((WindowState *)&stack0xffffffffffffffe0);
  if (local_20 != (element_type *)0x0) {
    (*(local_20->super_IWindowGroup)._vptr_IWindowGroup[10])
              (&local_40,local_20,
               IVar1.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    if (local_40._M_ptr !=
        (this->state).focused.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr) {
      std::__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_30,&local_40);
      UpdateFocusedWindow(this,(IWindowPtr *)&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      Window::InvalidateScreen();
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void App::EnsureFocusIsValid() {
    ILayoutPtr layout = this->state.ActiveLayout();
    if (layout) {
        IWindowPtr focused = layout->GetFocus();
        if (focused != this->state.focused) {
            this->UpdateFocusedWindow(focused);
            Window::InvalidateScreen();
        }
    }
}